

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::ASMapHealthCheck(CConnman *this)

{
  size_type __n;
  const_iterator cVar1;
  const_iterator cVar2;
  back_insert_iterator<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_> bVar3;
  long in_FS_OFFSET;
  vector<CNetAddr,_std::allocator<CNetAddr>_> clearnet_addrs;
  vector<CAddress,_std::allocator<CAddress>_> v6_addrs;
  vector<CAddress,_std::allocator<CAddress>_> v4_addrs;
  vector<CAddress,_std::allocator<CAddress>_> *in_stack_fffffffffffffec8;
  vector<CAddress,_std::allocator<CAddress>_> *in_stack_fffffffffffffed0;
  optional<Network> *in_stack_fffffffffffffed8;
  vector<CAddress,_std::allocator<CAddress>_> *this_00;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *this_01;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 filtered;
  size_t in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  CConnman *in_stack_ffffffffffffff40;
  _Optional_base<Network,_true,_true> in_stack_ffffffffffffff78;
  vector<CNetAddr,_std::allocator<CNetAddr>_> local_70;
  undefined4 local_54;
  vector<CAddress,_std::allocator<CAddress>_> local_50;
  undefined4 local_34;
  long local_8;
  
  filtered = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 1;
  std::optional<Network>::optional<Network,_true>
            (in_stack_fffffffffffffed8,(Network *)in_stack_fffffffffffffed0);
  GetAddresses(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               (optional<Network>)
               in_stack_ffffffffffffff78._M_payload.super__Optional_payload_base<Network>,
               (bool)filtered);
  local_54 = 2;
  std::optional<Network>::optional<Network,_true>
            (in_stack_fffffffffffffed8,(Network *)in_stack_fffffffffffffed0);
  GetAddresses(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               (optional<Network>)
               in_stack_ffffffffffffff78._M_payload.super__Optional_payload_base<Network>,
               (bool)filtered);
  this_01 = &local_70;
  std::vector<CNetAddr,_std::allocator<CNetAddr>_>::vector
            ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_fffffffffffffec8);
  __n = std::vector<CAddress,_std::allocator<CAddress>_>::size(in_stack_fffffffffffffec8);
  std::vector<CAddress,_std::allocator<CAddress>_>::size(in_stack_fffffffffffffec8);
  std::vector<CNetAddr,_std::allocator<CNetAddr>_>::reserve(this_01,__n);
  cVar1 = std::vector<CAddress,_std::allocator<CAddress>_>::begin(in_stack_fffffffffffffed0);
  cVar2 = std::vector<CAddress,_std::allocator<CAddress>_>::end(in_stack_fffffffffffffed0);
  bVar3 = std::back_inserter<std::vector<CNetAddr,std::allocator<CNetAddr>>>
                    ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_fffffffffffffed0);
  std::
  transform<__gnu_cxx::__normal_iterator<CAddress_const*,std::vector<CAddress,std::allocator<CAddress>>>,std::back_insert_iterator<std::vector<CNetAddr,std::allocator<CNetAddr>>>,CConnman::ASMapHealthCheck()::__0>
            (cVar1._M_current,cVar2._M_current,bVar3.container);
  this_00 = &local_50;
  cVar1 = std::vector<CAddress,_std::allocator<CAddress>_>::begin(in_stack_fffffffffffffed0);
  cVar2 = std::vector<CAddress,_std::allocator<CAddress>_>::end(in_stack_fffffffffffffed0);
  bVar3 = std::back_inserter<std::vector<CNetAddr,std::allocator<CNetAddr>>>
                    ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_fffffffffffffed0);
  std::
  transform<__gnu_cxx::__normal_iterator<CAddress_const*,std::vector<CAddress,std::allocator<CAddress>>>,std::back_insert_iterator<std::vector<CNetAddr,std::allocator<CNetAddr>>>,CConnman::ASMapHealthCheck()::__1>
            (cVar1._M_current,cVar2._M_current,bVar3.container);
  NetGroupManager::ASMapHealthCheck
            ((NetGroupManager *)cVar1._M_current,
             (vector<CNetAddr,_std::allocator<CNetAddr>_> *)cVar2._M_current);
  std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector
            ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)this_00);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(this_00);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::ASMapHealthCheck()
{
    const std::vector<CAddress> v4_addrs{GetAddresses(/*max_addresses=*/ 0, /*max_pct=*/ 0, Network::NET_IPV4, /*filtered=*/ false)};
    const std::vector<CAddress> v6_addrs{GetAddresses(/*max_addresses=*/ 0, /*max_pct=*/ 0, Network::NET_IPV6, /*filtered=*/ false)};
    std::vector<CNetAddr> clearnet_addrs;
    clearnet_addrs.reserve(v4_addrs.size() + v6_addrs.size());
    std::transform(v4_addrs.begin(), v4_addrs.end(), std::back_inserter(clearnet_addrs),
        [](const CAddress& addr) { return static_cast<CNetAddr>(addr); });
    std::transform(v6_addrs.begin(), v6_addrs.end(), std::back_inserter(clearnet_addrs),
        [](const CAddress& addr) { return static_cast<CNetAddr>(addr); });
    m_netgroupman.ASMapHealthCheck(clearnet_addrs);
}